

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tester.h
# Opt level: O0

void __thiscall MemVector<int>::MemVector(MemVector<int> *this,size_t size)

{
  size_t sVar1;
  allocator<int> local_65;
  value_type_conflict local_64;
  vector<int,_std::allocator<int>_> local_60;
  allocator<int> local_31;
  vector<int,_std::allocator<int>_> local_30;
  size_t local_18;
  size_t size_local;
  MemVector<int> *this_local;
  
  local_18 = size;
  size_local = (size_t)this;
  std::vector<int,_std::allocator<int>_>::vector(&this->vec_);
  std::vector<int,_std::allocator<int>_>::vector(&this->accesses_);
  sVar1 = local_18;
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector(&local_30,sVar1,&local_31);
  std::vector<int,_std::allocator<int>_>::operator=(&this->vec_,&local_30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_30);
  std::allocator<int>::~allocator(&local_31);
  sVar1 = local_18;
  local_64 = 0;
  std::allocator<int>::allocator(&local_65);
  std::vector<int,_std::allocator<int>_>::vector(&local_60,sVar1,&local_64,&local_65);
  std::vector<int,_std::allocator<int>_>::operator=(&this->accesses_,&local_60);
  std::vector<int,_std::allocator<int>_>::~vector(&local_60);
  std::allocator<int>::~allocator(&local_65);
  return;
}

Assistant:

MemVector(const size_t size)
    {
        vec_ = std::vector<T>(size);
        accesses_ = std::vector<int>(size, 0);
    }